

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O2

void __thiscall xercesc_4_0::SchemaAttDef::serialize(SchemaAttDef *this,XSerializeEngine *serEng)

{
  undefined8 in_RAX;
  DatatypeValidator *pDVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int i;
  
  i = (int)((ulong)in_RAX >> 0x20);
  XMLAttDef::serialize(&this->super_XMLAttDef,serEng);
  if (serEng->fStoreLoad != 0) {
    XSerializeEngine::readSize(serEng,&this->fElemId);
    XSerializeEngine::operator>>(serEng,&i);
    this->fPSVIScope = i;
    xercesc_4_0::operator>>(serEng,&this->fAttName);
    pDVar1 = DatatypeValidator::loadDV(serEng);
    this->fDatatypeValidator = pDVar1;
    XTemplateSerializer::loadObject(&this->fNamespaceList,8,false,serEng);
    xercesc_4_0::operator>>(serEng,&this->fBaseAttDecl);
    return;
  }
  XSerializeEngine::writeSize(serEng,this->fElemId);
  XSerializeEngine::operator<<(serEng,this->fPSVIScope);
  XSerializeEngine::write(serEng,(int)this->fAttName,__buf,in_RCX);
  DatatypeValidator::storeDV(serEng,this->fDatatypeValidator);
  XTemplateSerializer::storeObject(this->fNamespaceList,serEng);
  XSerializeEngine::write(serEng,(int)this->fBaseAttDecl,__buf_00,in_RCX);
  return;
}

Assistant:

void SchemaAttDef::serialize(XSerializeEngine& serEng)
{

    XMLAttDef::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fElemId);
        serEng<<(int)fPSVIScope;

        serEng<<fAttName;

        DatatypeValidator::storeDV(serEng, fDatatypeValidator);

        /***
         * Serialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::storeObject(fNamespaceList, serEng);

        serEng<<fBaseAttDecl;
    }
    else
    {

        serEng.readSize (fElemId);
        int i;
        serEng>>i;
        fPSVIScope = (PSVIDefs::PSVIScope)i;

        serEng>>fAttName;

        fDatatypeValidator    = DatatypeValidator::loadDV(serEng);

        /***
         * Deserialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::loadObject(&fNamespaceList, 8, false, serEng);

        serEng>>fBaseAttDecl;
    }
}